

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_NodeSimulate(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Ivy_FraigSim_t *pIVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_FraigSim_t *pIVar6;
  Ivy_FraigSim_t *pIVar7;
  int local_40;
  int i;
  int fCompl1;
  int fCompl0;
  int fCompl;
  Ivy_FraigSim_t *pSims1;
  Ivy_FraigSim_t *pSims0;
  Ivy_FraigSim_t *pSims;
  Ivy_Obj_t *pObj_local;
  Ivy_FraigMan_t *p_local;
  
  iVar1 = Ivy_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                  ,0x37c,"void Ivy_NodeSimulate(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  pIVar4 = Ivy_ObjSim(pObj);
  pIVar5 = Ivy_ObjFanin0(pObj);
  pIVar6 = Ivy_ObjSim(pIVar5);
  pIVar5 = Ivy_ObjFanin1(pObj);
  pIVar7 = Ivy_ObjSim(pIVar5);
  uVar2 = *(uint *)&pObj->field_0x8 >> 7 & 1;
  pIVar5 = Ivy_ObjChild0(pObj);
  iVar1 = Ivy_ObjFaninPhase(pIVar5);
  pIVar5 = Ivy_ObjChild1(pObj);
  iVar3 = Ivy_ObjFaninPhase(pIVar5);
  if ((iVar1 == 0) || (iVar3 == 0)) {
    if ((iVar1 == 0) || (iVar3 != 0)) {
      if ((iVar1 == 0) && (iVar3 != 0)) {
        if (uVar2 == 0) {
          for (local_40 = 0; local_40 < p->nSimWords; local_40 = local_40 + 1) {
            (&pIVar4[1].Type)[local_40] =
                 (&pIVar6[1].Type)[local_40] & ((&pIVar7[1].Type)[local_40] ^ 0xffffffffU);
          }
        }
        else {
          for (local_40 = 0; local_40 < p->nSimWords; local_40 = local_40 + 1) {
            (&pIVar4[1].Type)[local_40] =
                 (&pIVar6[1].Type)[local_40] ^ 0xffffffffU | (&pIVar7[1].Type)[local_40];
          }
        }
      }
      else if (uVar2 == 0) {
        for (local_40 = 0; local_40 < p->nSimWords; local_40 = local_40 + 1) {
          (&pIVar4[1].Type)[local_40] = (&pIVar6[1].Type)[local_40] & (&pIVar7[1].Type)[local_40];
        }
      }
      else {
        for (local_40 = 0; local_40 < p->nSimWords; local_40 = local_40 + 1) {
          (&pIVar4[1].Type)[local_40] =
               (&pIVar6[1].Type)[local_40] & (&pIVar7[1].Type)[local_40] ^ 0xffffffff;
        }
      }
    }
    else if (uVar2 == 0) {
      for (local_40 = 0; local_40 < p->nSimWords; local_40 = local_40 + 1) {
        (&pIVar4[1].Type)[local_40] =
             ((&pIVar6[1].Type)[local_40] ^ 0xffffffffU) & (&pIVar7[1].Type)[local_40];
      }
    }
    else {
      for (local_40 = 0; local_40 < p->nSimWords; local_40 = local_40 + 1) {
        (&pIVar4[1].Type)[local_40] =
             (&pIVar6[1].Type)[local_40] | (&pIVar7[1].Type)[local_40] ^ 0xffffffffU;
      }
    }
  }
  else if (uVar2 == 0) {
    for (local_40 = 0; local_40 < p->nSimWords; local_40 = local_40 + 1) {
      (&pIVar4[1].Type)[local_40] =
           ((&pIVar6[1].Type)[local_40] | (&pIVar7[1].Type)[local_40]) ^ 0xffffffff;
    }
  }
  else {
    for (local_40 = 0; local_40 < p->nSimWords; local_40 = local_40 + 1) {
      (&pIVar4[1].Type)[local_40] = (&pIVar6[1].Type)[local_40] | (&pIVar7[1].Type)[local_40];
    }
  }
  return;
}

Assistant:

void Ivy_NodeSimulate( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj )
{
    Ivy_FraigSim_t * pSims, * pSims0, * pSims1;
    int fCompl, fCompl0, fCompl1, i;
    assert( !Ivy_IsComplement(pObj) );
    // get hold of the simulation information
    pSims  = Ivy_ObjSim(pObj);
    pSims0 = Ivy_ObjSim(Ivy_ObjFanin0(pObj));
    pSims1 = Ivy_ObjSim(Ivy_ObjFanin1(pObj));
    // get complemented attributes of the children using their random info
    fCompl  = pObj->fPhase;
    fCompl0 = Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj));
    fCompl1 = Ivy_ObjFaninPhase(Ivy_ObjChild1(pObj));
    // simulate
    if ( fCompl0 && fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (pSims0->pData[i] | pSims1->pData[i]);
        else
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = ~(pSims0->pData[i] | pSims1->pData[i]);
    }
    else if ( fCompl0 && !fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (pSims0->pData[i] | ~pSims1->pData[i]);
        else
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (~pSims0->pData[i] & pSims1->pData[i]);
    }
    else if ( !fCompl0 && fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (~pSims0->pData[i] | pSims1->pData[i]);
        else
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (pSims0->pData[i] & ~pSims1->pData[i]);
    }
    else // if ( !fCompl0 && !fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = ~(pSims0->pData[i] & pSims1->pData[i]);
        else
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (pSims0->pData[i] & pSims1->pData[i]);
    }
}